

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall Excel::Stream::read<char>(Stream *this,char *retVal,int32_t bytes)

{
  ByteOrder BVar1;
  ulong uVar2;
  undefined8 uVar3;
  int in_EDX;
  byte *in_RSI;
  Exception *in_RDI;
  char c;
  int32_t i;
  wstring *what;
  undefined1 local_41 [40];
  char local_19;
  int local_18;
  int local_14;
  byte *local_10;
  
  *in_RSI = 0;
  local_14 = in_EDX;
  if (in_EDX == 0) {
    local_14 = 1;
  }
  local_18 = 0;
  local_10 = in_RSI;
  while( true ) {
    if (local_14 <= local_18) {
      return;
    }
    local_19 = (**(code **)(*(long *)in_RDI + 0x10))();
    uVar2 = (**(code **)(*(long *)in_RDI + 0x18))();
    if ((uVar2 & 1) != 0) break;
    BVar1 = SystemByteOrder::byteOrder();
    if (BVar1 == *(ByteOrder *)&in_RDI->field_0x8) {
      *local_10 = *local_10 | (byte)((int)local_19 << ((byte)(local_18 << 3) & 0x1f));
    }
    else {
      *local_10 = *local_10 |
                  (byte)((int)local_19 << ((((char)local_14 - (char)local_18) + -1) * '\b' & 0x1fU))
      ;
    }
    local_18 = local_18 + 1;
  }
  uVar3 = __cxa_allocate_exception(0x30);
  what = (wstring *)local_41;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring
            ((wstring *)(local_41 + 1),L"Unexpected end of file.",(allocator *)what);
  Exception::Exception(in_RDI,what);
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void read( Type & retVal, int32_t bytes = 0 )
	{
		retVal = Type(0);
		if( bytes == 0 ) bytes = sizeof( Type );

		for( int32_t i = 0; i < bytes; ++i )
		{
			Type c = (Type)(unsigned char) getByte();

			if( eof() )
				throw Exception( L"Unexpected end of file." );

			if( SystemByteOrder::byteOrder() != m_byteOrder )
				retVal |= ( c << 8 * ( bytes - i - 1 ) );
			else
				retVal |= ( c << 8 * i );
		}
	}